

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hpp
# Opt level: O3

ostream * operator<<(ostream *out,SpecificSolution *spec)

{
  SpecificSolution SVar1;
  runtime_error *this;
  long lVar2;
  char *pcVar3;
  
  SVar1 = *spec;
  if (SVar1 == kCannotSolve) {
    pcVar3 = "cannot solve";
    lVar2 = 0xc;
  }
  else if (SVar1 == kAnyNumberIsRoot) {
    pcVar3 = "any number";
    lVar2 = 10;
  }
  else {
    if (SVar1 != kNoRoots) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unexpected SpecificSolution found");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar3 = "no roots";
    lVar2 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar3,lVar2);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const SpecificSolution &spec) {
    switch (spec) {
        case SpecificSolution::kNoRoots:
            out << "no roots";
            break;
        case SpecificSolution::kAnyNumberIsRoot:
            out << "any number";
            break;
        case SpecificSolution::kCannotSolve:
            out << "cannot solve";
            break;
        default:
            throw std::runtime_error("Unexpected SpecificSolution found");
    }
    return out;
}